

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameLoop.cpp
# Opt level: O1

void GameLoop(Maze *maze)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Room *pRVar4;
  ostream *poVar5;
  long *plVar6;
  Room *pRVar7;
  long lVar8;
  char *pcVar9;
  uint local_5c;
  string local_50;
  
  pRVar4 = Maze::GetStart(maze);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"Welcome to the maze game! Use command x to E(x)it at any time.",0x3e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  local_5c = std::ostream::flush();
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Do you want room labels turned on? (y/n): ",0x2a);
    iVar2 = getchar();
    std::istream::ignore((long)&std::cin,1000);
    iVar3 = tolower((int)(char)iVar2);
    if (iVar3 == 0x79) {
      local_5c = 1;
    }
    else if (iVar3 == 0x6e) {
      local_5c = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Invalid input, try again.",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
    }
    iVar2 = tolower((int)(char)iVar2);
  } while ((iVar2 != 0x79) && (iVar2 != 0x6e));
  pRVar7 = Maze::GetEnd(maze);
  if (pRVar4 != pRVar7) {
    bVar1 = false;
    do {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      poVar5 = (ostream *)std::ostream::flush();
      if ((local_5c & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"You are in a room",0x11);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"You are in a room with label: \'",0x1f);
        Room::GetLabel_abi_cxx11_(&local_50,pRVar4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You can go: ",0xc);
      pRVar7 = Room::GetRoom(pRVar4,NORTH);
      if (pRVar7 != (Room *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(n)orth  ",9);
      }
      pRVar7 = Room::GetRoom(pRVar4,EAST);
      if (pRVar7 != (Room *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(e)ast  ",8);
      }
      pRVar7 = Room::GetRoom(pRVar4,SOUTH);
      if (pRVar7 != (Room *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(s)outh  ",9);
      }
      pRVar7 = Room::GetRoom(pRVar4,WEST);
      if (pRVar7 != (Room *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(w)est  ",8);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Please enter your command: ",0x1b);
      iVar2 = getchar();
      std::istream::ignore((long)&std::cin,1000);
      iVar2 = tolower((int)(char)iVar2);
      if (iVar2 < 0x73) {
        if (iVar2 == 0x65) {
          pRVar7 = Room::GetRoom(pRVar4,EAST);
          if (pRVar7 == (Room *)0x0) goto LAB_00102f76;
          lVar8 = 0x1c;
          pcVar9 = "Moving one room to the east.";
        }
        else {
          if (iVar2 != 0x6e) {
LAB_00102f87:
            lVar8 = 0x10;
            pcVar9 = "Invalid command!";
            goto LAB_00102f96;
          }
          pRVar7 = Room::GetRoom(pRVar4,NORTH);
          if (pRVar7 == (Room *)0x0) goto LAB_00102f76;
          lVar8 = 0x1d;
          pcVar9 = "Moving one room to the north.";
        }
LAB_00102f6c:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
LAB_00102f9b:
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
      }
      else {
        if (iVar2 == 0x73) {
          pRVar7 = Room::GetRoom(pRVar4,SOUTH);
          if (pRVar7 != (Room *)0x0) {
            lVar8 = 0x1d;
            pcVar9 = "Moving one room to the south.";
            goto LAB_00102f6c;
          }
LAB_00102f76:
          lVar8 = 0x17;
          pcVar9 = "You cannot go that way.";
LAB_00102f96:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
          pRVar7 = pRVar4;
          goto LAB_00102f9b;
        }
        if (iVar2 == 0x77) {
          pRVar7 = Room::GetRoom(pRVar4,WEST);
          if (pRVar7 == (Room *)0x0) goto LAB_00102f76;
          lVar8 = 0x1c;
          pcVar9 = "Moving one room to the west.";
          goto LAB_00102f6c;
        }
        if (iVar2 != 0x78) goto LAB_00102f87;
        bVar1 = true;
        pRVar7 = pRVar4;
      }
      pRVar4 = Maze::GetEnd(maze);
    } while ((pRVar7 != pRVar4) && (pRVar4 = pRVar7, !bVar1));
    if (bVar1) {
      pcVar9 = "We hope you come to play again!";
      lVar8 = 0x1f;
      goto LAB_00103009;
    }
  }
  pcVar9 = "Congratulations! You made it to the end! Now exiting.";
  lVar8 = 0x35;
LAB_00103009:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void GameLoop(Maze* maze)
{
    Room* currentRoom = maze->GetStart();
    bool exit = false;
    bool displayLabels;
    char labels;

    std::cout << std::endl << "Welcome to the maze game! Use command x to E(x)it at any time." << std::endl << std::endl;

    do
    {
        std::cout << "Do you want room labels turned on? (y/n): ";
        labels = std::getchar();
        std::cin.ignore(1000, '\n');

        if(tolower(labels) == 'y')
            displayLabels = true;
        else if(tolower(labels) == 'n')
            displayLabels = false;
        else
            std::cout << "Invalid input, try again." << std::endl << std::endl;

    } while(tolower(labels) != 'y' && tolower(labels) != 'n');

    while(currentRoom != maze->GetEnd() && !exit)
    {
        char command;

        if(displayLabels)
            std::cout << std::endl << "You are in a room with label: '" << currentRoom->GetLabel() << "'"<< std::endl;
        else
            std::cout << std::endl << "You are in a room" << std::endl;
        std::cout << "You can go: ";
        if(currentRoom->GetRoom(NORTH) != NULL)
            std::cout << "(n)orth  ";
        if(currentRoom->GetRoom(EAST) != NULL)
            std::cout << "(e)ast  ";
        if(currentRoom->GetRoom(SOUTH) != NULL)
            std::cout << "(s)outh  ";
        if(currentRoom->GetRoom(WEST) != NULL)
            std::cout << "(w)est  ";
        std::cout << std::endl;

        std::cout << "Please enter your command: ";
        command = std::getchar();
        std::cin.ignore(1000, '\n');

        switch(tolower(command))
        {
            case 'n':
            {
                Room *tmpRoom = currentRoom->GetRoom(NORTH);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the north." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'e':
            {
                Room *tmpRoom = currentRoom->GetRoom(EAST);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the east." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 's':
            {
                Room *tmpRoom = currentRoom->GetRoom(SOUTH);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the south." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'w':
            {
                Room *tmpRoom = currentRoom->GetRoom(WEST);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the west." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'x':
            {
                exit = true;
                break;
            }
            default:
            {
                std::cout << "Invalid command!" << std::endl;
            }
        }

    }

    if(exit)
    {
        std::cout << "We hope you come to play again!" << std::endl;
    }
    else
    {
        std::cout << "Congratulations! You made it to the end! Now exiting." << std::endl;
        return;
    }
}